

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool __thiscall
S2BooleanOperation::Impl::IsFullPolygonSymmetricDifference
          (Impl *this,S2ShapeIndex *a,S2ShapeIndex *b)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  bVar1 = GetFaceMask(a);
  bVar2 = GetFaceMask(b);
  if ((bVar2 | bVar1) == 0x3f) {
    dVar4 = S2::GetArea(a);
    dVar5 = S2::GetArea(b);
    dVar6 = (double)(**(code **)(*(long *)(this->op_->options_).snap_function_._M_t.
                                          super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
                                          .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false> +
                                0x10))();
    dVar4 = ABS(dVar4 - dVar5) -
            (ABS(12.566370614359172 - (dVar4 + dVar5)) + -12.566370614359172 + 12.566370614359172);
    if (ABS(dVar4) <= (dVar6 + 8.881784197001252e-16) * 6.283185307179586 + 8.881784197001252e-15) {
      bVar3 = (bVar2 & bVar1) != 0x3f;
    }
    else {
      bVar3 = 0.0 < dVar4;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool S2BooleanOperation::Impl::IsFullPolygonSymmetricDifference(
    const S2ShapeIndex& a, const S2ShapeIndex& b) const {
  // See comments in IsFullPolygonResult().  By far the most common case is
  // that the result is empty.

  // The result can be full only if the union of the two input geometries
  // intersects all six faces of the S2 cube.  This test is fast.
  uint8 a_mask = GetFaceMask(a);
  uint8 b_mask = GetFaceMask(b);
  if ((a_mask | b_mask) != kAllFacesMask) return false;

  // The symmetric difference area satisfies:
  //
  //   |A - B| <= SymmetricDifference(A, B) <= 4*Pi - |4*Pi - (A + B)|
  //
  // where A, B can refer to a polygon or its area.
  double a_area = S2::GetArea(a), b_area = S2::GetArea(b);
  double min_area = fabs(a_area - b_area);
  double max_area = 4 * M_PI - fabs(4 * M_PI - (a_area + b_area));

  // Now we choose the result that assumes the smallest amount of error
  // (min_area in the empty case, and (4*Pi - max_area) in the full case).
  // However in the case of symmetric difference these two errors may be equal,
  // meaning that the result is ambiguous.  This happens when both polygons have
  // area 2*Pi.  Furthermore, this can happen even when the areas are not
  // exactly 2*Pi due to snapping and area calculation errors.
  //
  // To determine whether the result is ambiguous, we compute a rough estimate
  // of the maximum expected area error (including errors due to snapping),
  // using the worst-case error bound for a hemisphere defined by 4 vertices.
  auto edge_snap_radius = op_->options_.snap_function().snap_radius() +
                          S2::kIntersectionError;  // split_crossing_edges
  double hemisphere_area_error = 2 * M_PI * edge_snap_radius.radians() +
                                 40 * DBL_EPSILON;  // GetCurvatureMaxError

  // The following sign is the difference between the error needed for an empty
  // result and the error needed for a full result.  It is negative if an
  // empty result is possible, positive if a full result is possible, and zero
  // if both results are possible.
  double error_sign = min_area - (4 * M_PI - max_area);
  if (fabs(error_sign) <= hemisphere_area_error) {
    // Handling the ambiguous case correctly requires a more sophisticated
    // algorithm (see below), but we can at least handle the simple cases by
    // testing whether both input geometries intersect all 6 cube faces.  If
    // not, then the result is definitely full.
    if ((a_mask & b_mask) != kAllFacesMask) return true;

    // Otherwise both regions have area 2*Pi and intersect all 6 cube faces.
    // We choose "empty" in this case under the assumption that it is more
    // likely that the user is computing the difference between two nearly
    // identical polygons.
    //
    // TODO(ericv): Implement a robust algorithm based on examining the edge
    // snapping results directly, or alternatively add another heuristic (such
    // as testing containment of random points, or using a larger bit mask in
    // the tests above, e.g. a 24-bit mask representing all level 1 cells).
    return false;
  }
  return error_sign > 0;
}